

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O2

int bcf_has_filter(bcf_hdr_t *hdr,bcf1_t *line,char *filter)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  
  if ((*filter == '.') && (filter[1] == '\0')) {
    filter = "PASS";
  }
  uVar3 = bcf_hdr_id2int(hdr,0,filter);
  iVar4 = -1;
  if ((-1 < (int)uVar3) && ((~(hdr->id[0][uVar3].val)->info[0] & 0xf) != 0)) {
    if ((line->unpacked & 2) == 0) {
      bcf_unpack(line,2);
    }
    uVar2 = (line->d).n_flt;
    iVar4 = 1;
    if (uVar3 != 0 || uVar2 != 0) {
      uVar6 = 0;
      uVar5 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar5 = uVar6;
      }
      do {
        if (uVar5 == uVar6) {
          return 0;
        }
        puVar1 = (uint *)((line->d).flt + uVar6);
        uVar6 = uVar6 + 1;
      } while (*puVar1 != uVar3);
    }
  }
  return iVar4;
}

Assistant:

int bcf_has_filter(const bcf_hdr_t *hdr, bcf1_t *line, char *filter)
{
    if ( filter[0]=='.' && !filter[1] ) filter = "PASS";
    int id = bcf_hdr_id2int(hdr, BCF_DT_ID, filter);
    if ( !bcf_hdr_idinfo_exists(hdr,BCF_HL_FLT,id) ) return -1;  // not defined in the header

    if ( !(line->unpacked & BCF_UN_FLT) ) bcf_unpack(line, BCF_UN_FLT);
    if ( id==0 && !line->d.n_flt) return 1; // PASS

    int i;
    for (i=0; i<line->d.n_flt; i++)
        if ( line->d.flt[i]==id ) return 1;
    return 0;
}